

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularEnum::GenerateAggregateInitializer
          (SingularEnum *this,Printer *p)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if ((this->super_FieldGeneratorBase).should_split_ == true) {
    pcVar2 = "\n        decltype(Impl_::Split::$name$_){$kDefault$},\n      ";
    uVar1 = 0x3c;
  }
  else {
    pcVar2 = "\n        decltype($field_$){$kDefault$},\n      ";
    uVar1 = 0x2f;
  }
  google::protobuf::io::Printer::Emit(p,0,0,uVar1,pcVar2);
  return;
}

Assistant:

void GenerateAggregateInitializer(io::Printer* p) const override {
    if (should_split()) {
      p->Emit(R"cc(
        decltype(Impl_::Split::$name$_){$kDefault$},
      )cc");
    } else {
      p->Emit(R"cc(
        decltype($field_$){$kDefault$},
      )cc");
    }
  }